

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes ReadNumber(CSzData *sd,UInt64 *value)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  
  sVar4 = sd->Size;
  if (sVar4 == 0) {
    return 0x10;
  }
  sd->Size = sVar4 - 1;
  pbVar5 = sd->Data;
  sd->Data = pbVar5 + 1;
  bVar1 = *pbVar5;
  uVar3 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if (sVar4 - 1 == 0) {
      return 0x10;
    }
    sd->Size = sVar4 - 2;
    sd->Data = pbVar5 + 2;
    bVar7 = pbVar5[1];
    if ((bVar1 & 0x40) == 0) {
      uVar6 = (ulong)((uVar3 & 0x3f) << 8 | (uint)bVar7);
    }
    else {
      if (sVar4 - 2 == 0) {
        return 0x10;
      }
      sd->Size = sVar4 - 3;
      sd->Data = pbVar5 + 3;
      uVar6 = (ulong)CONCAT11(pbVar5[2],bVar7);
      *value = uVar6;
      pbVar5 = pbVar5 + 4;
      sVar4 = sVar4 - 4;
      bVar7 = 0x20;
      lVar2 = 0x10;
      while( true ) {
        if (lVar2 == 0x40) {
          return 0;
        }
        if ((bVar7 & bVar1) == 0) break;
        if (sVar4 == 0xffffffffffffffff) {
          return 0x10;
        }
        sd->Size = sVar4;
        sd->Data = pbVar5;
        uVar6 = uVar6 | (ulong)pbVar5[-1] << ((byte)lVar2 & 0x3f);
        *value = uVar6;
        bVar7 = bVar7 >> 1;
        pbVar5 = pbVar5 + 1;
        sVar4 = sVar4 - 1;
        lVar2 = lVar2 + 8;
      }
      uVar6 = uVar6 | (ulong)(bVar7 - 1 & uVar3) << ((byte)lVar2 & 0x3f);
    }
  }
  else {
    uVar6 = (ulong)uVar3;
  }
  *value = uVar6;
  return 0;
}

Assistant:

static MY_NO_INLINE SRes ReadNumber(CSzData *sd, UInt64 *value)
{
  Byte firstByte, mask;
  unsigned i;
  UInt32 v;

  SZ_READ_BYTE(firstByte);
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    return SZ_OK;
  }
  SZ_READ_BYTE(v);
  if ((firstByte & 0x40) == 0)
  {
    *value = (((UInt32)firstByte & 0x3F) << 8) | v;
    return SZ_OK;
  }
  SZ_READ_BYTE(mask);
  *value = v | ((UInt32)mask << 8);
  mask = 0x20;
  for (i = 2; i < 8; i++)
  {
    Byte b;
    if ((firstByte & mask) == 0)
    {
      UInt64 highPart = (unsigned)firstByte & (unsigned)(mask - 1);
      *value |= (highPart << (8 * i));
      return SZ_OK;
    }
    SZ_READ_BYTE(b);
    *value |= ((UInt64)b << (8 * i));
    mask >>= 1;
  }
  return SZ_OK;
}